

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O0

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  string *lname;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  size_type sVar5;
  reference pbVar6;
  long lVar7;
  ostream *poVar8;
  char *pcVar9;
  cmTarget *pcVar10;
  PolicyID id;
  byte local_e41;
  allocator local_e29;
  string local_e28;
  allocator local_e01;
  string local_e00;
  cmTarget *local_de0;
  cmTarget *tgt;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dd0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dc8;
  undefined1 local_dc0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string local_da0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d80;
  undefined1 local_d78 [8];
  string msg;
  ostringstream local_d38 [8];
  ostringstream e_6;
  allocator local_bb9;
  string local_bb8;
  string local_b98;
  ostringstream local_b78 [8];
  ostringstream e_5;
  string local_a00;
  ostringstream local_9e0 [8];
  ostringstream e_4;
  undefined1 local_860 [4];
  TargetType type;
  ostringstream local_840 [8];
  ostringstream e_3;
  allocator local_6c1;
  string local_6c0;
  cmTarget *local_6a0;
  cmTarget *aliasedTarget;
  ostringstream local_678 [8];
  ostringstream e_2;
  allocator local_4f9;
  string local_4f8;
  char *local_4d8;
  char *aliasedName;
  ostringstream local_4b0 [8];
  ostringstream e_1;
  allocator local_331;
  string local_330;
  allocator local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  uint local_24c;
  string local_248;
  string local_228;
  byte local_201;
  undefined1 local_200 [7];
  bool issueMessage;
  ostringstream e;
  MessageType local_88;
  bool local_81;
  MessageType messageType;
  bool nameOk;
  byte local_76;
  byte local_75;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  bool isAlias;
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  bool use_macbundle;
  reference pbStack_70;
  bool use_win32;
  string *exename;
  const_iterator s;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddExecutableCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_0063a0a4;
  }
  exename = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
  pbStack_70 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&exename);
  local_71 = 0;
  local_72 = 0;
  local_73 = 0;
  local_74 = 0;
  local_75 = 0;
  local_76 = 0;
LAB_00638bd7:
  _messageType = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&exename,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&messageType);
  if (bVar2) {
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&exename);
    bVar2 = std::operator==(pbVar6,"WIN32");
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&exename);
      local_71 = 1;
    }
    else {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
      bVar2 = std::operator==(pbVar6,"MACOSX_BUNDLE");
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&exename);
        local_72 = 1;
      }
      else {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
        bVar2 = std::operator==(pbVar6,"EXCLUDE_FROM_ALL");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&exename);
          local_73 = 1;
        }
        else {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&exename);
          bVar2 = std::operator==(pbVar6,"IMPORTED");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&exename);
            local_74 = 1;
          }
          else {
            if ((local_74 & 1) != 0) {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&exename);
              bVar2 = std::operator==(pbVar6,"GLOBAL");
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename);
                local_75 = 1;
                goto LAB_00638bd7;
              }
            }
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&exename);
            bVar2 = std::operator==(pbVar6,"ALIAS");
            if (!bVar2) goto LAB_00638d28;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&exename);
            local_76 = 1;
          }
        }
      }
    }
    goto LAB_00638bd7;
  }
LAB_00638d28:
  bVar2 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
  local_e41 = 0;
  if (bVar2) {
    bVar2 = cmGlobalGenerator::IsReservedTarget(pbStack_70);
    local_e41 = bVar2 ^ 0xff;
  }
  local_81 = (bool)(local_e41 & 1);
  if (((local_81 != false) && ((local_74 & 1) == 0)) && ((local_76 & 1) == 0)) {
    lVar7 = std::__cxx11::string::find((char)pbStack_70,0x3a);
    local_81 = lVar7 == -1;
  }
  if (local_81 == false) {
    local_88 = AUTHOR_WARNING;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    local_201 = 0;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x25,id);
        poVar8 = std::operator<<((ostream *)local_200,(string *)&local_228);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&local_228);
        local_201 = 1;
      }
      else if (PVar3 - NEW < 3) {
        local_201 = 1;
        local_88 = FATAL_ERROR;
      }
    }
    if ((local_201 & 1) == 0) {
LAB_00638f78:
      local_24c = 0;
    }
    else {
      poVar8 = std::operator<<((ostream *)local_200,"The target name \"");
      poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
      std::operator<<(poVar8,
                      "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                     );
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,local_88,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      if (local_88 != FATAL_ERROR) goto LAB_00638f78;
      this_local._7_1_ = 0;
      local_24c = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    if (local_24c != 0) goto LAB_0063a0a4;
  }
  if (((local_74 & 1) == 0) ||
     ((((local_71 & 1) == 0 && ((local_72 & 1) == 0)) && ((local_73 & 1) == 0)))) {
    if ((local_76 & 1) == 0) {
      if ((local_74 & 1) == 0) {
        std::__cxx11::string::string((string *)local_d78);
        bVar2 = cmMakefile::EnforceUniqueName
                          ((this->super_cmCommand).Makefile,pbStack_70,(string *)local_d78,false);
        if (!bVar2) {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_d78);
          this_local._7_1_ = 0;
        }
        local_24c = (uint)!bVar2;
        std::__cxx11::string::~string((string *)local_d78);
        if (local_24c == 0) {
          local_d80._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
          bVar2 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&exename,&local_d80);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_da0,
                       "called with incorrect number of arguments, no sources provided",
                       (allocator *)
                       ((long)&srclists.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            cmCommand::SetError(&this->super_cmCommand,&local_da0);
            std::__cxx11::string::~string((string *)&local_da0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&srclists.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            this_local._7_1_ = 0;
          }
          else {
            local_dc8._M_current = exename;
            local_dd0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)((long)&tgt + 7));
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_dc0,local_dc8,local_dd0,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&tgt + 7));
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&tgt + 7));
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar9 = (char *)std::__cxx11::string::c_str();
            pcVar10 = cmMakefile::AddExecutable
                                (pcVar1,pcVar9,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_dc0,(bool)(local_73 & 1));
            local_de0 = pcVar10;
            if ((local_71 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_e00,"WIN32_EXECUTABLE",&local_e01);
              cmTarget::SetProperty(pcVar10,&local_e00,"ON");
              std::__cxx11::string::~string((string *)&local_e00);
              std::allocator<char>::~allocator((allocator<char> *)&local_e01);
            }
            pcVar10 = local_de0;
            if ((local_72 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_e28,"MACOSX_BUNDLE",&local_e29);
              cmTarget::SetProperty(pcVar10,&local_e28,"ON");
              std::__cxx11::string::~string((string *)&local_e28);
              std::allocator<char>::~allocator((allocator<char> *)&local_e29);
            }
            this_local._7_1_ = 1;
            local_24c = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_dc0);
          }
        }
      }
      else {
        pcVar10 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,pbStack_70,false);
        if (pcVar10 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget
                    ((this->super_cmCommand).Makefile,pbStack_70,EXECUTABLE,(bool)(local_75 & 1));
          this_local._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_d38);
          poVar8 = std::operator<<((ostream *)local_d38,"cannot create imported target \"");
          poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
          std::operator<<(poVar8,"\" because another target with the same name already exists.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)((long)&msg.field_2 + 8));
          std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
          this_local._7_1_ = 0;
          local_24c = 1;
          std::__cxx11::ostringstream::~ostringstream(local_d38);
        }
      }
    }
    else {
      bVar2 = cmGeneratorExpression::IsValidTargetName(pbStack_70);
      if (bVar2) {
        if ((local_73 & 1) == 0) {
          if (((local_74 & 1) == 0) && ((local_75 & 1) == 0)) {
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            if (sVar5 == 3) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&exename);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              pcVar1 = (this->super_cmCommand).Makefile;
              local_4d8 = pcVar9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_4f8,pcVar9,&local_4f9);
              bVar2 = cmMakefile::IsAlias(pcVar1,&local_4f8);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
              pcVar9 = local_4d8;
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream(local_678);
                poVar8 = std::operator<<((ostream *)local_678,"cannot create ALIAS target \"");
                poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
                poVar8 = std::operator<<(poVar8,"\" because target \"");
                poVar8 = std::operator<<(poVar8,local_4d8);
                std::operator<<(poVar8,"\" is itself an ALIAS.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
                std::__cxx11::string::~string((string *)&aliasedTarget);
                this_local._7_1_ = 0;
                local_24c = 1;
                std::__cxx11::ostringstream::~ostringstream(local_678);
              }
              else {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_6c0,pcVar9,&local_6c1);
                pcVar10 = cmMakefile::FindTargetToUse(pcVar1,&local_6c0,true);
                std::__cxx11::string::~string((string *)&local_6c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
                local_6a0 = pcVar10;
                if (pcVar10 == (cmTarget *)0x0) {
                  std::__cxx11::ostringstream::ostringstream(local_840);
                  poVar8 = std::operator<<((ostream *)local_840,"cannot create ALIAS target \"");
                  poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
                  poVar8 = std::operator<<(poVar8,"\" because target \"");
                  poVar8 = std::operator<<(poVar8,local_4d8);
                  std::operator<<(poVar8,"\" does not already exist.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_860);
                  std::__cxx11::string::~string((string *)local_860);
                  this_local._7_1_ = 0;
                  local_24c = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_840);
                }
                else {
                  TVar4 = cmTarget::GetType(pcVar10);
                  if (TVar4 == EXECUTABLE) {
                    bVar2 = cmTarget::IsImported(local_6a0);
                    lname = pbStack_70;
                    pcVar9 = local_4d8;
                    if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream(local_b78);
                      poVar8 = std::operator<<((ostream *)local_b78,"cannot create ALIAS target \"")
                      ;
                      poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
                      poVar8 = std::operator<<(poVar8,"\" because target \"");
                      poVar8 = std::operator<<(poVar8,local_4d8);
                      std::operator<<(poVar8,"\" is IMPORTED.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_b98);
                      std::__cxx11::string::~string((string *)&local_b98);
                      this_local._7_1_ = 0;
                      local_24c = 1;
                      std::__cxx11::ostringstream::~ostringstream(local_b78);
                    }
                    else {
                      pcVar1 = (this->super_cmCommand).Makefile;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_bb8,pcVar9,&local_bb9);
                      cmMakefile::AddAlias(pcVar1,lname,&local_bb8);
                      std::__cxx11::string::~string((string *)&local_bb8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
                      this_local._7_1_ = 1;
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream(local_9e0);
                    poVar8 = std::operator<<((ostream *)local_9e0,"cannot create ALIAS target \"");
                    poVar8 = std::operator<<(poVar8,(string *)pbStack_70);
                    poVar8 = std::operator<<(poVar8,"\" because target \"");
                    poVar8 = std::operator<<(poVar8,local_4d8);
                    std::operator<<(poVar8,"\" is not an executable.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_a00);
                    std::__cxx11::string::~string((string *)&local_a00);
                    this_local._7_1_ = 0;
                    local_24c = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_9e0);
                  }
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_4b0);
              std::operator<<((ostream *)local_4b0,"ALIAS requires exactly one target argument.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
              std::__cxx11::string::~string((string *)&aliasedName);
              this_local._7_1_ = 0;
              local_24c = 1;
              std::__cxx11::ostringstream::~ostringstream(local_4b0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_330,"IMPORTED with ALIAS is not allowed.",&local_331);
            cmCommand::SetError(&this->super_cmCommand,&local_330);
            std::__cxx11::string::~string((string *)&local_330);
            std::allocator<char>::~allocator((allocator<char> *)&local_331);
            this_local._7_1_ = 0;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_308,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",&local_309);
          cmCommand::SetError(&this->super_cmCommand,&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::operator+(&local_2e8,"Invalid name for ALIAS: ",pbStack_70);
        cmCommand::SetError(&this->super_cmCommand,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    if ((local_71 & 1) == 0) {
      if ((local_72 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2c0,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target.",
                   &local_2c1);
        cmCommand::SetError(&this->super_cmCommand,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_298,"may not be given MACOSX_BUNDLE for an IMPORTED target.",
                   &local_299);
        cmCommand::SetError(&this->super_cmCommand,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_270,"may not be given WIN32 for an IMPORTED target.",&local_271);
      cmCommand::SetError(&this->super_cmCommand,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
    this_local._7_1_ = 0;
  }
LAB_0063a0a4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      /* clang-format off */
      e << "The target name \"" << exename <<
          "\" is reserved or not valid for certain "
          "CMake features, such as generator expressions, and may result "
          "in undefined behavior.";
      /* clang-format on */
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an "
                          "executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  if (s == args.end()) {
    this->SetError(
      "called with incorrect number of arguments, no sources provided");
    return false;
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename.c_str(), srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}